

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M2L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  size_type sVar24;
  ostream *this;
  reference pvVar25;
  reference pvVar26;
  reference pvVar27;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pMVar28;
  Scalar *pSVar29;
  Scalar *pSVar30;
  double dVar31;
  reference pvVar32;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar33;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> PVar58;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  PVar59;
  XprTypeNested local_1028;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1020;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1010;
  Type local_ff8;
  Type local_fc0;
  undefined1 local_f88 [8];
  Matrix<double,_4,_4,_0,_4,_4> sol;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_efb [3];
  Matrix<double,4,4,0,4,4> local_ef8 [8];
  Matrix<double,_4,_4,_0,_4,_4> Tw;
  Scalar local_e70;
  Scalar local_e68;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_e60;
  undefined1 local_e40 [8];
  Matrix<double,_3,_1,_0,_3,_1> t;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_e20;
  double local_df8;
  Scalar local_df0;
  Scalar local_de8;
  Scalar local_de0;
  double local_dd8;
  double local_dd0;
  Scalar local_dc8;
  double local_dc0;
  double local_db8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_db0;
  undefined1 local_d90 [8];
  Matrix<double,_3,_3,_0,_3,_3> R;
  double tz;
  double s;
  size_t iter;
  vector<double,_std::allocator<double>_> realRoots;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  double e;
  double d;
  double c;
  double b;
  double a;
  double m26;
  double m25;
  double m24;
  double m23;
  double m22;
  double m21;
  double m16;
  double m15;
  double m14;
  double m13;
  double m12;
  double m11;
  double l26;
  double l25;
  double l24;
  double l23;
  double l22;
  double l21;
  double l16;
  double l15;
  double l14;
  double l13;
  double l12;
  double l11;
  RhsNested local_c00;
  Matrix<double,6,1,0,6,1> local_bf8 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU6;
  Matrix<double,6,1,0,6,1> local_bb8 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU5;
  Matrix<double,6,1,0,6,1> local_b78 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU4;
  Matrix<double,6,1,0,6,1> local_b38 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU3;
  Matrix<double,6,1,0,6,1> local_af8 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU2;
  Matrix<double,6,1,0,6,1> local_ab8 [8];
  Matrix<double,_6,_1,_0,_6,_1> lU1;
  Type local_a80;
  Type local_a48;
  Type local_a10;
  Matrix<double,_3,_1,_0,_3,_1> local_9d8;
  Matrix<double,_3,_3,_0,_3,_3> local_9c0;
  NegativeReturnType local_978;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_968;
  Type local_920;
  Type local_8e8;
  Type local_8b0;
  Type local_878;
  Type local_840;
  Type local_808;
  Type local_7d0;
  Matrix<double,_3,_1,_0,_3,_1> local_798;
  Matrix<double,_3,_3,_0,_3,_3> local_780;
  NegativeReturnType local_738;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_728;
  Type local_6e0;
  Type local_6a8;
  Type local_670;
  Type local_638;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_5fb [3];
  Matrix<double,6,6,0,6,6> local_5f8 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  local_4cb [3];
  Matrix<double,6,6,0,6,6> local_4c8 [8];
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_6,_1,_0,_6,_1> local_278;
  undefined1 local_240 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  trans;
  undefined1 local_1a0 [8];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines3;
  undefined1 local_100 [8];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines2;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_d8;
  undefined1 local_50 [8];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar24 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::size(lCPair);
  if (sVar24 == 0) {
    sVar24 = std::
             vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             ::size(lPair);
    if (sVar24 < 2) {
      this = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  lines1.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  pvVar25 = std::
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lCPair,0);
  std::
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::pair(&local_d8,pvVar25);
  getPluckerCoord<double>
            ((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_50,&local_d8);
  pvVar25 = std::
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lPair,0);
  std::
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::pair((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
          *)&lines3.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar25);
  getPluckerCoord<double>
            ((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_100,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&lines3.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar25 = std::
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lPair,1);
  std::
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  ::pair((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
          *)&trans.
             super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar25);
  getPluckerCoord<double>
            ((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_1a0,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&trans.
                 super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar26 = std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_50,0);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix(&local_278,pvVar26);
  pvVar26 = std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_50,1);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),pvVar26);
  getPredefinedTransformations1M1Q<double>
            ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)local_240,&local_278,
             (Matrix<double,_6,_1,_0,_6,_1> *)
             (TU1.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf));
  pvVar27 = std::
            vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          *)local_240,0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),pvVar27);
  pvVar27 = std::
            vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          *)local_240,1);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),pvVar27);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_4c8,local_4cb);
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<double,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            (local_5f8,local_5fb);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_638,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_670,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_670,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_638);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_6a8,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            (&local_6e0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,3,3,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_6e0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_6a8);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_7d0,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),3,1);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Matrix<double,3,1,0,3,1> *)&local_798,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_7d0);
  getSkew<double>(&local_780,&local_798);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            (&local_738,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_780);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_808,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),3,3);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_728,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_738,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
              &local_808);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            (&local_840,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,3,0,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_840,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
              *)&local_728);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_878,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_8b0,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_8b0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_878);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_8e8,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),3,3);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            (&local_920,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,3,3,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_920,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_8e8);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_a10,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),3,1);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>
            ((Matrix<double,3,1,0,3,1> *)&local_9d8,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_a10);
  getSkew<double>(&local_9c0,&local_9d8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            (&local_978,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_9c0);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_a48,
             (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x23),3,3);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_968,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_978,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
              &local_a48);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<int,int>
            (&local_a80,(DenseBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,3,0,3,3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false> *)&local_a80,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
              *)&local_968);
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_50,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,pMVar28);
  lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_ab8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lU2.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_50,1);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,pMVar28);
  lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_af8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lU3.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_100,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,pMVar28);
  lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_b38,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lU4.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_100,1);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,pMVar28);
  lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_b78,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lU5.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_1a0,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_4c8,pMVar28);
  lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_bb8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)(lU6.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 5));
  pMVar28 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          *)local_1a0,1);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,0,6,6>> *)local_5f8,pMVar28);
  local_c00 = PVar58.m_rhs;
  l11 = (double)PVar58.m_lhs;
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (local_bf8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&l11);
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,0);
  dVar1 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,1);
  dVar2 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,2);
  dVar3 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,3);
  dVar4 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,4);
  dVar5 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b38,5);
  dVar6 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,0);
  dVar31 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,1);
  dVar7 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,2);
  dVar8 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,3);
  dVar9 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,4);
  dVar10 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bb8,5);
  dVar11 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,0);
  dVar12 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,1);
  dVar13 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,2);
  dVar14 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,3);
  dVar15 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,4);
  dVar16 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_b78,5);
  dVar17 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,0);
  dVar18 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,1);
  dVar19 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,2);
  dVar20 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,3);
  dVar21 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,4);
  dVar22 = *pSVar29;
  pSVar29 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_bf8,5);
  dVar23 = *pSVar29;
  dVar44 = dVar1 + dVar1;
  dVar34 = dVar44 * dVar31;
  dVar48 = (dVar4 + dVar4) * dVar31;
  dVar35 = dVar44 * dVar7;
  dVar36 = dVar2 + dVar2;
  dVar41 = dVar36 * dVar31;
  dVar38 = dVar36 * dVar7;
  dVar56 = (dVar4 + dVar4) * dVar7;
  dVar49 = (dVar5 + dVar5) * dVar31;
  dVar53 = (dVar5 + dVar5) * dVar7;
  dVar50 = dVar1 * 4.0;
  dVar42 = dVar1 + dVar1;
  dVar54 = dVar2 + dVar2;
  dVar51 = dVar2 * 4.0;
  dVar57 = dVar1 + dVar1;
  dVar45 = dVar57 * dVar31;
  dVar43 = (dVar4 + dVar4) * dVar31;
  dVar55 = dVar57 * dVar7;
  dVar37 = dVar2 + dVar2;
  dVar46 = dVar37 * dVar31;
  dVar47 = dVar37 * dVar7;
  dVar39 = (dVar4 + dVar4) * dVar7;
  dVar52 = (dVar5 + dVar5) * dVar31;
  dVar40 = (dVar5 + dVar5) * dVar7;
  Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix
            ((Matrix<double,_5,_1,_0,_5,_1> *)
             &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0,0);
  *pSVar30 = dVar6 * dVar7 * dVar14 * dVar18 +
             ((dVar3 * dVar7 * dVar17 * dVar18 +
              ((((dVar1 * dVar11 * dVar13 * dVar20 +
                 dVar1 * dVar8 * dVar13 * dVar23 +
                 ((dVar5 * dVar31 * dVar13 * dVar19 +
                  dVar2 * dVar10 * dVar12 * dVar19 +
                  ((dVar2 * dVar7 * dVar12 * dVar22 +
                   dVar2 * dVar31 * dVar16 * dVar19 +
                   ((((dVar4 * dVar31 * dVar12 * dVar19 +
                      dVar2 * dVar9 * dVar12 * dVar18 +
                      dVar2 * dVar31 * dVar12 * dVar21 +
                      (((dVar1 * dVar31 * dVar15 * dVar19 - dVar1 * dVar31 * dVar13 * dVar21) -
                       dVar1 * dVar7 * dVar15 * dVar18) - dVar1 * dVar9 * dVar13 * dVar18)) -
                     dVar4 * dVar7 * dVar12 * dVar18) - dVar1 * dVar7 * dVar13 * dVar22) -
                   dVar1 * dVar10 * dVar13 * dVar19)) - dVar2 * dVar7 * dVar16 * dVar18)) -
                 dVar5 * dVar7 * dVar13 * dVar18)) - dVar2 * dVar8 * dVar12 * dVar23) -
               dVar2 * dVar11 * dVar12 * dVar20) - dVar3 * dVar31 * dVar17 * dVar19)) -
             dVar6 * dVar31 * dVar14 * dVar19);
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,1,0);
  *pSVar30 = ((dVar36 * dVar11 * dVar13 * dVar20 +
              dVar36 * dVar8 * dVar13 * dVar23 +
              ((dVar53 * dVar13 * dVar19 +
               (((dVar38 * dVar16 * dVar19 +
                 ((dVar44 * dVar11 * dVar12 * dVar20 +
                  dVar44 * dVar8 * dVar12 * dVar23 +
                  ((dVar49 * dVar13 * dVar18 +
                   dVar49 * dVar12 * dVar19 +
                   dVar56 * dVar13 * dVar18 +
                   dVar56 * dVar12 * dVar19 +
                   ((dVar36 * dVar10 * dVar12 * dVar18 +
                    ((((dVar38 * dVar12 * dVar21 +
                       dVar41 * dVar16 * dVar18 +
                       dVar41 * dVar15 * dVar19 +
                       (((((dVar44 * dVar9 * dVar13 * dVar19 +
                           dVar35 * dVar16 * dVar18 +
                           dVar35 * dVar15 * dVar19 +
                           ((((dVar34 * dVar13 * dVar22 +
                              dVar48 * dVar12 * dVar18 +
                              ((dVar34 * dVar15 * dVar18 - dVar34 * dVar12 * dVar21) -
                              dVar44 * dVar9 * dVar12 * dVar18)) - dVar34 * dVar16 * dVar19) -
                            dVar35 * dVar12 * dVar22) - dVar35 * dVar13 * dVar21)) -
                          dVar44 * dVar10 * dVar12 * dVar19) - dVar44 * dVar10 * dVar13 * dVar18) -
                        dVar41 * dVar12 * dVar22) - dVar41 * dVar13 * dVar21)) -
                      dVar38 * dVar15 * dVar18) - dVar36 * dVar9 * dVar12 * dVar19) -
                    dVar36 * dVar9 * dVar13 * dVar18)) - dVar48 * dVar13 * dVar19)) -
                  dVar53 * dVar12 * dVar18)) - dVar38 * dVar13 * dVar22)) -
                dVar36 * dVar10 * dVar13 * dVar19) - (dVar3 + dVar3) * dVar31 * dVar17 * dVar18)) -
              (dVar6 + dVar6) * dVar31 * dVar14 * dVar18)) -
             (dVar3 + dVar3) * dVar7 * dVar17 * dVar19) - (dVar6 + dVar6) * dVar7 * dVar14 * dVar19;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,2,0);
  *pSVar30 = (dVar5 + dVar5) * dVar7 * dVar13 * dVar18 +
             dVar5 * 4.0 * dVar7 * dVar12 * dVar19 +
             (((((dVar51 * dVar9 * dVar13 * dVar19 +
                 dVar54 * dVar7 * dVar16 * dVar18 +
                 dVar51 * dVar7 * dVar15 * dVar19 +
                 ((((dVar51 * dVar31 * dVar13 * dVar22 +
                    dVar42 * dVar10 * dVar13 * dVar19 +
                    ((dVar42 * dVar7 * dVar13 * dVar22 +
                     dVar5 * 4.0 * dVar31 * dVar12 * dVar18 +
                     (dVar4 + dVar4) * dVar7 * dVar12 * dVar18 +
                     ((((dVar51 * dVar31 * dVar15 * dVar18 +
                        (((dVar42 * dVar9 * dVar13 * dVar18 +
                          dVar50 * dVar9 * dVar12 * dVar19 +
                          dVar42 * dVar7 * dVar15 * dVar18 +
                          ((((dVar50 * dVar31 * dVar12 * dVar22 + dVar42 * dVar31 * dVar13 * dVar21)
                            - dVar42 * dVar31 * dVar15 * dVar19) - dVar50 * dVar31 * dVar16 * dVar18
                           ) - dVar50 * dVar7 * dVar12 * dVar21)) -
                         dVar50 * dVar10 * dVar12 * dVar18) - dVar54 * dVar31 * dVar12 * dVar21)) -
                       dVar54 * dVar9 * dVar12 * dVar18) -
                      (dVar4 + dVar4) * dVar31 * dVar12 * dVar19) -
                     dVar4 * 4.0 * dVar31 * dVar13 * dVar18)) - dVar50 * dVar7 * dVar16 * dVar19)) -
                   dVar54 * dVar31 * dVar16 * dVar19) - dVar54 * dVar7 * dVar12 * dVar22) -
                 dVar51 * dVar7 * dVar13 * dVar21)) - dVar54 * dVar10 * dVar12 * dVar19) -
               dVar51 * dVar10 * dVar13 * dVar18) - dVar4 * 4.0 * dVar7 * dVar13 * dVar19) -
             (dVar5 + dVar5) * dVar31 * dVar13 * dVar19);
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,3,0);
  *pSVar30 = ((dVar37 * dVar11 * dVar13 * dVar20 +
              dVar37 * dVar8 * dVar13 * dVar23 +
              ((((dVar37 * dVar10 * dVar13 * dVar19 +
                 ((dVar47 * dVar13 * dVar22 +
                  dVar57 * dVar11 * dVar12 * dVar20 +
                  dVar57 * dVar8 * dVar12 * dVar23 +
                  dVar40 * dVar12 * dVar18 +
                  (((((dVar43 * dVar13 * dVar19 +
                      ((dVar37 * dVar9 * dVar13 * dVar18 +
                       dVar37 * dVar9 * dVar12 * dVar19 +
                       dVar47 * dVar15 * dVar18 +
                       ((((dVar46 * dVar13 * dVar21 +
                          dVar46 * dVar12 * dVar22 +
                          dVar57 * dVar10 * dVar13 * dVar18 +
                          dVar57 * dVar10 * dVar12 * dVar19 +
                          ((((dVar55 * dVar13 * dVar21 +
                             dVar55 * dVar12 * dVar22 +
                             dVar45 * dVar16 * dVar19 +
                             (((dVar57 * dVar9 * dVar12 * dVar18 +
                               (dVar45 * dVar12 * dVar21 - dVar45 * dVar15 * dVar18)) -
                              dVar43 * dVar12 * dVar18) - dVar45 * dVar13 * dVar22)) -
                            dVar55 * dVar15 * dVar19) - dVar55 * dVar16 * dVar18) -
                          dVar57 * dVar9 * dVar13 * dVar19)) - dVar46 * dVar15 * dVar19) -
                        dVar46 * dVar16 * dVar18) - dVar47 * dVar12 * dVar21)) -
                      dVar37 * dVar10 * dVar12 * dVar18)) - dVar39 * dVar12 * dVar19) -
                    dVar39 * dVar13 * dVar18) - dVar52 * dVar12 * dVar19) - dVar52 * dVar13 * dVar18
                  )) - dVar47 * dVar16 * dVar19)) - (dVar3 + dVar3) * dVar31 * dVar17 * dVar18) -
               dVar40 * dVar13 * dVar19) - (dVar6 + dVar6) * dVar31 * dVar14 * dVar18)) -
             (dVar3 + dVar3) * dVar7 * dVar17 * dVar19) - (dVar6 + dVar6) * dVar7 * dVar14 * dVar19;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,4,0);
  *pSVar30 = (dVar6 * dVar31 * dVar14 * dVar19 +
             ((dVar3 * dVar31 * dVar17 * dVar19 +
              dVar2 * dVar11 * dVar12 * dVar20 +
              dVar2 * dVar8 * dVar12 * dVar23 +
              ((((dVar5 * dVar31 * dVar13 * dVar19 +
                 dVar2 * dVar10 * dVar12 * dVar19 +
                 ((dVar2 * dVar7 * dVar12 * dVar22 +
                  dVar2 * dVar31 * dVar16 * dVar19 +
                  ((((dVar4 * dVar31 * dVar12 * dVar19 +
                     dVar2 * dVar9 * dVar12 * dVar18 +
                     dVar2 * dVar31 * dVar12 * dVar21 +
                     (((dVar1 * dVar31 * dVar15 * dVar19 - dVar1 * dVar31 * dVar13 * dVar21) -
                      dVar1 * dVar7 * dVar15 * dVar18) - dVar1 * dVar9 * dVar13 * dVar18)) -
                    dVar4 * dVar7 * dVar12 * dVar18) - dVar1 * dVar7 * dVar13 * dVar22) -
                  dVar1 * dVar10 * dVar13 * dVar19)) - dVar2 * dVar7 * dVar16 * dVar18)) -
                dVar5 * dVar7 * dVar13 * dVar18) - dVar1 * dVar8 * dVar13 * dVar23) -
              dVar1 * dVar11 * dVar13 * dVar20)) - dVar3 * dVar7 * dVar17 * dVar18)) -
             dVar6 * dVar7 * dVar14 * dVar18;
  o4_roots<double>((vector<double,_std::allocator<double>_> *)&iter,
                   (Matrix<double,_5,_1,_0,_5,_1> *)
                   &realRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  s = 0.0;
  while( true ) {
    dVar31 = (double)std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)&iter);
    if ((ulong)dVar31 <= (ulong)s) break;
    pvVar32 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&iter,(size_type)s);
    dVar31 = *pvVar32;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         -(((dVar4 + dVar4) * dVar13 * dVar31 +
           (((dVar1 + dVar1) * dVar16 * dVar31 +
            dVar6 * dVar14 * dVar31 * dVar31 +
            dVar3 * dVar17 * dVar31 * dVar31 +
            (((((dVar6 * dVar14 +
                dVar3 * dVar17 + dVar5 * dVar13 + dVar2 * dVar16 + dVar1 * dVar15 + dVar4 * dVar12)
               - dVar1 * dVar15 * dVar31 * dVar31) - dVar4 * dVar12 * dVar31 * dVar31) -
             dVar2 * dVar16 * dVar31 * dVar31) - dVar5 * dVar13 * dVar31 * dVar31)) -
           (dVar2 + dVar2) * dVar15 * dVar31)) - (dVar5 + dVar5) * dVar12 * dVar31) /
         ((dVar2 + dVar2) * dVar13 * dVar31 +
         (dVar1 + dVar1) * dVar12 * dVar31 +
         ((dVar1 * dVar13 * dVar31 * dVar31 + (dVar2 * dVar12 - dVar1 * dVar13)) -
         dVar2 * dVar12 * dVar31 * dVar31));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_d90);
    local_db8 = 1.0 - dVar31 * dVar31;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
              (&local_db0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d90,&local_db8);
    local_dc0 = dVar31 * -2.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (&local_db0,&local_dc0);
    local_dc8 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_dc8);
    local_dd0 = dVar31 + dVar31;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_dd0);
    local_dd8 = 1.0 - dVar31 * dVar31;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_dd8);
    local_de0 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_de0);
    local_de8 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_de8);
    local_df0 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_df0);
    local_df8 = dVar31 * dVar31 + 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar33,&local_df8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_db0);
    t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         1.0 / (dVar31 * dVar31 + 1.0);
    Eigen::operator*(&local_e20,
                     t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array + 2,(StorageBaseType *)local_d90);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,3,3,0,3,3> *)local_d90,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_e20);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_e40);
    local_e68 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_e60,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e40,&local_e68);
    local_e70 = 0.0;
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (&local_e60,&local_e70);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (this_00,R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array + 8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_e60);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
              (local_ef8,local_efb);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_f88);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_fc0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_ef8,3,3);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_fc0,
               (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d90);
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_ff8,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_ef8,3,1);
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_ff8,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e40);
    local_1028 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                            (TUL1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + 0x23));
    PVar59 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                       ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)&local_1028,
                        (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_ef8);
    local_1020 = PVar59;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
    ::operator*(&local_1010,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Matrix<double,4,4,0,4,4>,0>>
                 *)&local_1020,
                (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                (TU2.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                 array + 0xf));
    Eigen::Matrix<double,4,4,0,4,4>::operator=
              ((Matrix<double,4,4,0,4,4> *)local_f88,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                *)&local_1010);
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_f88);
    s = (double)((long)s + 1);
  }
  lines1.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&iter);
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *)local_240);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_1a0);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_100);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_50);
  if ((lines1.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}